

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this)

{
  pointer pcVar1;
  pointer ppcVar2;
  cmGlobalGenerator *this_00;
  TargetType TVar3;
  string *psVar4;
  ostream *poVar5;
  pointer ppcVar6;
  cmGlobalGenerator *this_01;
  pointer ppcVar7;
  string fname;
  cmGeneratedFileStream fout;
  string local_2c0;
  string local_2a0;
  pointer local_280;
  cmGeneratedFileStream local_278;
  
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar1,pcVar1 + psVar4->_M_string_length);
  std::__cxx11::string::append((char *)&local_2c0);
  std::__cxx11::string::append((char *)&local_2c0);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,&local_2c0,false,None);
  ppcVar6 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_280 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (ppcVar6 != local_280) {
    do {
      ppcVar2 = ((*ppcVar6)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar7 = ((*ppcVar6)->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
          ppcVar7 = ppcVar7 + 1) {
        this_00 = (cmGlobalGenerator *)*ppcVar7;
        this_01 = this_00;
        TVar3 = cmGeneratorTarget::GetType((cmGeneratorTarget *)this_00);
        if (TVar3 != INTERFACE_LIBRARY) {
          WriteSummary(this_01,(cmGeneratorTarget *)this_00);
          cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_2a0,(cmGeneratorTarget *)this_00)
          ;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_278,local_2a0._M_dataplus._M_p,
                              local_2a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
            operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      ppcVar6 = ppcVar6 + 1;
    } while (ppcVar6 != local_280);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary()
{
  // Record all target directories in a central location.
  std::string fname = this->CMakeInstance->GetHomeOutputDirectory();
  fname += "/CMakeFiles";
  fname += "/TargetDirectories.txt";
  cmGeneratedFileStream fout(fname);

  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& tgts = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* tgt : tgts) {
      if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->WriteSummary(tgt);
      fout << tgt->GetSupportDirectory() << "\n";
    }
  }
}